

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetColumnWidth(int column_index,float width)

{
  ImGuiWindow *pIVar1;
  ImGuiColumnsSet *columns;
  ImGuiWindow *window;
  
  pIVar1 = GetCurrentWindowRead();
  GetColumnOffset((int)((ulong)pIVar1 >> 0x20));
  SetColumnOffset(columns._4_4_,columns._0_4_);
  return;
}

Assistant:

void ImGui::SetColumnWidth(int column_index, float width)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    SetColumnOffset(column_index + 1, GetColumnOffset(column_index) + width);
}